

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AdsDef.cpp
# Opt level: O0

AmsNetId make_AmsNetId(string *addr)

{
  bool bVar1;
  int iVar2;
  AmsNetId AVar3;
  istream *piVar4;
  char *__nptr;
  bool local_1d9;
  ulong local_1c0;
  size_t i;
  string s;
  istringstream local_198 [8];
  istringstream iss;
  string *addr_local;
  AmsNetId id;
  
  std::__cxx11::istringstream::istringstream(local_198,addr,8);
  std::__cxx11::string::string((string *)&i);
  local_1c0 = 0;
  AmsNetId::AmsNetId((AmsNetId *)((long)&addr_local + 2),0);
  while( true ) {
    local_1d9 = false;
    if (local_1c0 < 6) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)local_198,(string *)&i,'.');
      local_1d9 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    }
    if (local_1d9 == false) break;
    __nptr = (char *)std::__cxx11::string::c_str();
    iVar2 = atoi(__nptr);
    *(char *)((long)&addr_local + local_1c0 + 2) = (char)(iVar2 % 0x100);
    local_1c0 = local_1c0 + 1;
  }
  if (local_1c0 == 6) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_198,(string *)&i,'.');
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar4 + *(long *)(*(long *)piVar4 + -0x18)));
    if (!bVar1) goto LAB_0016bbd9;
  }
  memset((void *)((long)&addr_local + 2),0,6);
LAB_0016bbd9:
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::istringstream::~istringstream(local_198);
  AVar3.b[4] = addr_local._6_1_;
  AVar3.b[5] = addr_local._7_1_;
  AVar3.b[0] = addr_local._2_1_;
  AVar3.b[1] = addr_local._3_1_;
  AVar3.b[2] = addr_local._4_1_;
  AVar3.b[3] = addr_local._5_1_;
  return (AmsNetId)AVar3.b;
}

Assistant:

AmsNetId make_AmsNetId(const std::string& addr)
{
    std::istringstream iss(addr);
    std::string s;
    size_t i = 0;
    AmsNetId id {};

    while ((i < sizeof(id.b)) && std::getline(iss, s, '.')) {
        id.b[i] = atoi(s.c_str()) % 256;
        ++i;
    }

    if ((i != sizeof(id.b)) || std::getline(iss, s, '.')) {
        memset(id.b, 0, sizeof(id.b));
    }
    return id;
}